

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icosahedralBuilder.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  int i;
  int iVar3;
  SimInfo *pSVar4;
  Icosahedron *this;
  RegularDecahedron *this_00;
  InoDecahedron *this_01;
  Decahedron *this_02;
  CurlingStoneDecahedron *this_03;
  MoLocator *this_04;
  Molecule *mol;
  long lVar5;
  DumpWriter *this_05;
  TruncatedCube *this_06;
  RegularCuboctahedron *this_07;
  uint index;
  ulong uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> Points;
  double local_328;
  Vector3d boxMin;
  Vector3d boxMax;
  Mat3x3d boundingBox;
  string outputFileName;
  SimCreator newCreator;
  string inputFileName;
  Vector<double,_3U> local_238;
  MoleculeIterator mi;
  string local_210;
  string local_1f0;
  SimCreator oldCreator;
  gengetopt_args_info args_info;
  Vector<double,_3U> local_48;
  
  inputFileName._M_dataplus._M_p = (pointer)&inputFileName.field_2;
  inputFileName._M_string_length = 0;
  inputFileName.field_2._M_local_buf[0] = '\0';
  outputFileName._M_dataplus._M_p = (pointer)&outputFileName.field_2;
  outputFileName._M_string_length = 0;
  outputFileName.field_2._M_local_buf[0] = '\0';
  iVar3 = cmdline_parser(argc,argv,&args_info);
  if (iVar3 != 0) {
    exit(1);
  }
  if (args_info.inputs_num == 0) {
    builtin_strncpy(painCave.errMsg + 0x31,"and line",9);
    builtin_strncpy(painCave.errMsg + 0x20,"ified on the comm",0x11);
    builtin_strncpy(painCave.errMsg + 0x10,"le name was spec",0x10);
    builtin_strncpy(painCave.errMsg,"No input .omd fi",0x10);
    painCave.isFatal = 1;
    cmdline_parser_print_help();
    simError();
  }
  else {
    std::__cxx11::string::assign((char *)&inputFileName);
  }
  if (((args_info.shells_given == 0) && (args_info.cuboctahedron_given == 0)) &&
     (args_info.truncatedCube_given == 0)) {
    memcpy(&painCave,
           "icosahedralBuilder:  The number of shells\n\tis required to build a Mackay Icosahedron."
           ,0x56);
    painCave.isFatal = 1;
    cmdline_parser_print_help();
    simError();
    iVar3 = -1;
  }
  else {
    iVar3 = args_info.shells_arg;
    if (args_info.shells_arg < 0) {
      memcpy(&painCave,
             "icosahedralBuilder:  The number of shells\n\tmust be greater than or equal to zero.",
             0x52);
      painCave.isFatal = 1;
      cmdline_parser_print_help();
      simError();
    }
  }
  if (args_info.latticeConstant_given == 0) {
    builtin_strncpy(painCave.errMsg,"icosahedralBuilder:  No lattice constant\n\tgiven.",0x31);
    painCave.isFatal = 1;
    cmdline_parser_print_help();
    local_328 = 0.0;
    simError();
  }
  else {
    local_328 = args_info.latticeConstant_arg;
  }
  oldCreator.mdFileName_._M_dataplus._M_p = (pointer)&oldCreator.mdFileName_.field_2;
  oldCreator._vptr_SimCreator = (_func_int **)&PTR__SimCreator_002040a8;
  oldCreator.mdFileName_._M_string_length = 0;
  oldCreator.mdFileName_.field_2._M_local_buf[0] = '\0';
  pSVar4 = OpenMD::SimCreator::createSim(&oldCreator,&inputFileName,false);
  Points.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Points.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Points.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (args_info.ico_given == 0) {
    if (args_info.deca_given == 0) {
      if (args_info.ino_given == 0) {
        if (args_info.marks_given == 0) {
          if (args_info.stone_given == 0) {
            if (args_info.truncatedCube_given != 0 || args_info.cuboctahedron_given != 0) {
              boundingBox.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
                   = (double)(boundingBox.super_SquareMatrix<double,_3>.
                              super_RectMatrix<double,_3U,_3U>.data_[0] + 2);
              boundingBox.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1]
                   = 0.0;
              boundingBox.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2]
              ._0_1_ = 0;
              if (args_info.lattice_given == 0) {
                builtin_strncpy(painCave.errMsg + 0x20,"ype given.",0xb);
                builtin_strncpy(painCave.errMsg + 0x10,"er: No lattice t",0x10);
                builtin_strncpy(painCave.errMsg,"icosahedralBuild",0x10);
                painCave.isFatal = 1;
                cmdline_parser_print_help();
                simError();
              }
              else {
                std::__cxx11::string::assign((char *)&boundingBox);
              }
              iVar3 = args_info.unitCells_arg;
              if (args_info.unitCells_given == 0) {
                builtin_strncpy(painCave.errMsg + 0x20," unit cells.",0xd);
                builtin_strncpy(painCave.errMsg + 0x10,"er: Must specify",0x10);
                builtin_strncpy(painCave.errMsg,"icosahedralBuild",0x10);
                painCave.isFatal = 1;
                cmdline_parser_print_help();
                simError();
                iVar3 = 0;
              }
              if (args_info.truncatedCube_given == 0) {
                this_07 = (RegularCuboctahedron *)operator_new(0x60);
                std::__cxx11::string::string((string *)&local_210,(string *)&boundingBox);
                OpenMD::RegularCuboctahedron::RegularCuboctahedron(this_07,&local_210,iVar3);
                std::__cxx11::string::~string((string *)&local_210);
                (*(this_07->super_Cuboctahedron)._vptr_Cuboctahedron[2])(&newCreator,this_07);
              }
              else {
                this_06 = (TruncatedCube *)operator_new(0x60);
                std::__cxx11::string::string((string *)&local_1f0,(string *)&boundingBox);
                OpenMD::TruncatedCube::TruncatedCube
                          (this_06,&local_1f0,iVar3,args_info.truncatedPlanes_arg);
                std::__cxx11::string::~string((string *)&local_1f0);
                (*(this_06->super_Cuboctahedron)._vptr_Cuboctahedron[2])(&newCreator,this_06);
              }
              std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
              _M_move_assign(&Points,&newCreator);
              std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ::~_Vector_base((_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               *)&newCreator);
              std::__cxx11::string::~string((string *)&boundingBox);
            }
            goto LAB_00117a32;
          }
          this_03 = (CurlingStoneDecahedron *)operator_new(0x50);
          OpenMD::CurlingStoneDecahedron::CurlingStoneDecahedron
                    (this_03,args_info.columnAtoms_arg,iVar3,args_info.twinAtoms_arg,
                     args_info.truncatedPlanes_arg);
          (*(this_03->super_Decahedron)._vptr_Decahedron[2])(&boundingBox,this_03);
        }
        else {
          this_02 = (Decahedron *)operator_new(0x48);
          OpenMD::Decahedron::Decahedron
                    (this_02,args_info.columnAtoms_arg,iVar3,args_info.twinAtoms_arg);
          (*this_02->_vptr_Decahedron[2])(&boundingBox,this_02);
        }
      }
      else {
        this_01 = (InoDecahedron *)operator_new(0x48);
        OpenMD::InoDecahedron::InoDecahedron(this_01,args_info.columnAtoms_arg,iVar3);
        (*(this_01->super_Decahedron)._vptr_Decahedron[2])(&boundingBox,this_01);
      }
    }
    else {
      this_00 = (RegularDecahedron *)operator_new(0x48);
      OpenMD::RegularDecahedron::RegularDecahedron(this_00,iVar3);
      (*(this_00->super_Decahedron)._vptr_Decahedron[2])(&boundingBox,this_00);
    }
  }
  else {
    this = (Icosahedron *)operator_new(0x68);
    OpenMD::Icosahedron::Icosahedron(this);
    OpenMD::Icosahedron::getPoints
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               &boundingBox,this,iVar3);
  }
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::_M_move_assign
            (&Points,&boundingBox);
  std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
  ~_Vector_base((_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                &boundingBox);
LAB_00117a32:
  std::__cxx11::string::assign((char *)&outputFileName);
  createMdFile(&inputFileName,&outputFileName,
               (int)(((long)Points.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)Points.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18));
  if (pSVar4 != (SimInfo *)0x0) {
    (*pSVar4->_vptr_SimInfo[1])(pSVar4);
  }
  newCreator.mdFileName_._M_dataplus._M_p = (pointer)&newCreator.mdFileName_.field_2;
  newCreator._vptr_SimCreator = (_func_int **)&PTR__SimCreator_002040a8;
  newCreator.mdFileName_._M_string_length = 0;
  newCreator.mdFileName_.field_2._M_local_buf[0] = '\0';
  pSVar4 = OpenMD::SimCreator::createSim(&newCreator,&outputFileName,false);
  mi._M_node = (_Base_ptr)0x0;
  OpenMD::SimInfo::beginMolecule(pSVar4,&mi);
  this_04 = (MoLocator *)operator_new(0x30);
  OpenMD::MoLocator::MoLocator
            (this_04,*(pSVar4->moleculeStamps_).
                      super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,pSVar4->forceField_);
  OpenMD::Vector<double,_3U>::Vector(&boxMax.super_Vector<double,_3U>);
  OpenMD::Vector<double,_3U>::Vector(&boxMin.super_Vector<double,_3U>);
  for (index = 0; uVar6 = (ulong)index,
      uVar6 < (ulong)(((long)Points.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)Points.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); index = index + 1) {
    mol = OpenMD::SimInfo::getMoleculeByGlobalIndex(pSVar4,index);
    OpenMD::Vector<double,_3U>::Vector((Vector<double,_3U> *)&boundingBox);
    if (args_info.truncatedCube_given == 0 && args_info.cuboctahedron_given == 0) {
      OpenMD::operator*(&local_48,
                        &Points.
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar6].super_Vector<double,_3U>,
                        local_328);
      OpenMD::operator/(&local_238,&local_48,1.4142135623730951);
      OpenMD::Vector3<double>::operator=((Vector3<double> *)&boundingBox,&local_238);
    }
    else {
      OpenMD::operator*(&local_238,
                        &Points.
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar6].super_Vector<double,_3U>,
                        local_328);
      OpenMD::Vector3<double>::operator=((Vector3<double> *)&boundingBox,&local_238);
    }
    OpenMD::Vector<double,_3U>::Vector(&local_238);
    local_238.data_[0] = 0.0;
    local_238.data_[1] = 0.0;
    local_238.data_[2] = 1.0;
    if (uVar6 == 0) {
      OpenMD::Vector<double,_3U>::operator=
                (&boxMax.super_Vector<double,_3U>,(Vector<double,_3U> *)&boundingBox);
      OpenMD::Vector<double,_3U>::operator=
                (&boxMin.super_Vector<double,_3U>,(Vector<double,_3U> *)&boundingBox);
    }
    else {
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        dVar1 = boundingBox.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                [lVar5];
        uVar7 = SUB84(dVar1,0);
        uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
        dVar2 = boxMax.super_Vector<double,_3U>.data_[lVar5];
        dVar9 = dVar1;
        if (dVar1 <= dVar2) {
          dVar9 = dVar2;
        }
        boxMax.super_Vector<double,_3U>.data_[lVar5] = dVar9;
        dVar2 = boxMin.super_Vector<double,_3U>.data_[lVar5];
        if (dVar2 <= dVar1) {
          uVar7 = SUB84(dVar2,0);
          uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
        }
        boxMin.super_Vector<double,_3U>.data_[lVar5] = (double)CONCAT44(uVar8,uVar7);
      }
    }
    OpenMD::MoLocator::placeMol(this_04,(Vector3d *)&boundingBox,(Vector3d *)&local_238,mol);
  }
  OpenMD::SquareMatrix<double,_3>::SquareMatrix(&boundingBox.super_SquareMatrix<double,_3>);
  boundingBox.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
       (boxMax.super_Vector<double,_3U>.data_[0] - boxMin.super_Vector<double,_3U>.data_[0]) * 10.0;
  boundingBox.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
       (boxMax.super_Vector<double,_3U>.data_[1] - boxMin.super_Vector<double,_3U>.data_[1]) * 10.0;
  boundingBox.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
       (boxMax.super_Vector<double,_3U>.data_[2] - boxMin.super_Vector<double,_3U>.data_[2]) * 10.0;
  OpenMD::Snapshot::setHmat(pSVar4->sman_->currentSnapshot_,&boundingBox);
  this_05 = (DumpWriter *)operator_new(0x60);
  OpenMD::DumpWriter::DumpWriter(this_05,pSVar4,&outputFileName);
  OpenMD::DumpWriter::writeDump(this_05);
  OpenMD::DumpWriter::~DumpWriter(this_05);
  operator_delete(this_05,0x60);
  snprintf(painCave.errMsg,2000,"A new OpenMD file called \"%s\" has been generated.\n",
           outputFileName._M_dataplus._M_p);
  painCave.isFatal = 0;
  painCave.severity = 3;
  simError();
  OpenMD::SimCreator::~SimCreator(&newCreator);
  std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
  ~_Vector_base(&Points.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               );
  OpenMD::SimCreator::~SimCreator(&oldCreator);
  std::__cxx11::string::~string((string *)&outputFileName);
  std::__cxx11::string::~string((string *)&inputFileName);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  gengetopt_args_info args_info;
  std::string inputFileName;
  std::string outputFileName;

  MoLocator* locator;
  RealType latticeConstant(0.0);
  int nShells(-1);

  DumpWriter* writer;

  // Parse Command Line Arguments
  if (cmdline_parser(argc, argv, &args_info) != 0) exit(1);

  /* get input file name */
  if (args_info.inputs_num)
    inputFileName = args_info.inputs[0];
  else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "No input .omd file name was specified "
             "on the command line");
    painCave.isFatal = 1;
    cmdline_parser_print_help();
    simError();
  }

  if (args_info.shells_given ||
      (args_info.cuboctahedron_given || args_info.truncatedCube_given)) {
    nShells = args_info.shells_arg;
    if (nShells < 0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "icosahedralBuilder:  The number of shells\n"
               "\tmust be greater than or equal to zero.");
      painCave.isFatal = 1;
      cmdline_parser_print_help();
      simError();
    }
  } else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "icosahedralBuilder:  The number of shells\n"
             "\tis required to build a Mackay Icosahedron.");
    painCave.isFatal = 1;
    cmdline_parser_print_help();
    simError();
  }

  if (args_info.latticeConstant_given) {
    latticeConstant = args_info.latticeConstant_arg;
  } else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "icosahedralBuilder:  No lattice constant\n"
             "\tgiven.");
    painCave.isFatal = 1;
    cmdline_parser_print_help();
    simError();
  }

  /* parse md file and set up the system */
  SimCreator oldCreator;
  SimInfo* oldInfo = oldCreator.createSim(inputFileName, false);

  vector<Vector3d> Points;
  if (args_info.ico_given) {
    Icosahedron* ico = new Icosahedron();
    Points           = ico->getPoints(nShells);
  } else if (args_info.deca_given) {
    RegularDecahedron* deca = new RegularDecahedron(nShells);
    Points                  = deca->getPoints();
  } else if (args_info.ino_given) {
    int columnAtoms    = args_info.columnAtoms_arg;
    InoDecahedron* ino = new InoDecahedron(columnAtoms, nShells);
    Points             = ino->getPoints();
  } else if (args_info.marks_given) {
    int columnAtoms   = args_info.columnAtoms_arg;
    int twinAtoms     = args_info.twinAtoms_arg;
    Decahedron* marks = new Decahedron(columnAtoms, nShells, twinAtoms);
    Points            = marks->getPoints();
  } else if (args_info.stone_given) {
    int columnAtoms             = args_info.columnAtoms_arg;
    int twinAtoms               = args_info.twinAtoms_arg;
    int truncatedPlanes         = args_info.truncatedPlanes_arg;
    CurlingStoneDecahedron* csd = new CurlingStoneDecahedron(
        columnAtoms, nShells, twinAtoms, truncatedPlanes);
    Points = csd->getPoints();
  } else if (args_info.cuboctahedron_given || args_info.truncatedCube_given) {
    std::string lattice;
    int unitCells = 0;
    if (args_info.lattice_given) {
      lattice = args_info.lattice_arg;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "icosahedralBuilder: No lattice type given.");
      painCave.isFatal = 1;
      cmdline_parser_print_help();
      simError();
    }
    if (args_info.unitCells_given) {
      unitCells = args_info.unitCells_arg;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "icosahedralBuilder: Must specify unit cells.");
      painCave.isFatal = 1;
      cmdline_parser_print_help();
      simError();
    }
    if (args_info.truncatedCube_given) {
      int truncatedPlanes = args_info.truncatedPlanes_arg;
      TruncatedCube* tc =
          new TruncatedCube(lattice, unitCells, truncatedPlanes);
      Points = tc->getPoints();
    } else {
      RegularCuboctahedron* rc = new RegularCuboctahedron(lattice, unitCells);
      Points                   = rc->getPoints();
    }
  }

  outputFileName = args_info.output_arg;

  // create a new .omd file on fly which corrects the number of
  // molecules

  createMdFile(inputFileName, outputFileName, Points.size());

  delete oldInfo;

  SimCreator newCreator;
  SimInfo* NewInfo = newCreator.createSim(outputFileName, false);

  // Place molecules
  Molecule* mol;
  SimInfo::MoleculeIterator mi;
  mol = NewInfo->beginMolecule(mi);

  int l = 0;

  locator =
      new MoLocator(NewInfo->getMoleculeStamp(0), NewInfo->getForceField());

  Vector3d boxMax;
  Vector3d boxMin;

  for (unsigned int n = 0; n < Points.size(); n++) {
    mol = NewInfo->getMoleculeByGlobalIndex(l);

    Vector3d location;
    if (args_info.cuboctahedron_given || args_info.truncatedCube_given) {
      // The cubic structures are built with a unit spacing between cells
      location = Points[n] * latticeConstant;
    } else {
      // The polyhedra are built with a unit spacing between atoms,
      // which in an FCC lattice should be multiplied by a / sqrt(2).
      location = Points[n] * latticeConstant / sqrt(2.0);
    }
    Vector3d orientation = Vector3d(0, 0, 1.0);

    if (n == 0) {
      boxMax = location;
      boxMin = location;
    } else {
      for (int i = 0; i < 3; i++) {
        boxMax[i] = max(boxMax[i], location[i]);
        boxMin[i] = min(boxMin[i], location[i]);
      }
    }

    locator->placeMol(location, orientation, mol);
    l++;
  }

  Mat3x3d boundingBox;
  boundingBox(0, 0) = 10.0 * (boxMax[0] - boxMin[0]);
  boundingBox(1, 1) = 10.0 * (boxMax[1] - boxMin[1]);
  boundingBox(2, 2) = 10.0 * (boxMax[2] - boxMin[2]);

  // set Hmat
  NewInfo->getSnapshotManager()->getCurrentSnapshot()->setHmat(boundingBox);

  // create dumpwriter and write out the coordinates
  writer = new DumpWriter(NewInfo, outputFileName);

  if (writer == NULL) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Error in creating dumpwriter object ");
    painCave.isFatal = 1;
    simError();
  }

  writer->writeDump();

  // deleting the writer will put the closing at the end of the dump file

  delete writer;

  // clean up by calling simError.....
  snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
           "A new OpenMD file called \"%s\" has been "
           "generated.\n",
           outputFileName.c_str());
  painCave.isFatal  = 0;
  painCave.severity = OPENMD_INFO;
  simError();
  return 0;
}